

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chunk_reader_suite.cpp
# Opt level: O2

void number_suite::outer_real(void)

{
  bool bVar1;
  undefined4 local_16c;
  view_type local_168;
  chunk_reader reader;
  
  trial::protocol::json::basic_reader<char>::basic_reader(&reader.super_basic_reader<char>);
  local_168._M_len = 1;
  local_168._M_str = "0";
  bVar1 = trial::protocol::json::basic_chunk_reader<char>::next
                    ((basic_chunk_reader<char> *)&reader.super_basic_reader<char>,&local_168);
  boost::detail::test_impl
            ("!reader.next(\"0\")",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/chunk_reader_suite.cpp"
             ,0x4a,"void number_suite::outer_real()",!bVar1);
  local_168._M_len =
       CONCAT44(local_168._M_len._4_4_,reader.super_basic_reader<char>.decoder.current.code);
  local_16c = 1;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::token::code::value,trial::protocol::json::token::code::value>
            ("reader.code()","token::code::uninitialized",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/chunk_reader_suite.cpp"
             ,0x4b,"void number_suite::outer_real()",&local_168,&local_16c);
  local_168._M_len = 2;
  local_168._M_str = "0.";
  bVar1 = trial::protocol::json::basic_chunk_reader<char>::next(&reader,&local_168);
  boost::detail::test_impl
            ("!reader.next(\"0.\")",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/chunk_reader_suite.cpp"
             ,0x4c,"void number_suite::outer_real()",!bVar1);
  local_168._M_len =
       CONCAT44(local_168._M_len._4_4_,reader.super_basic_reader<char>.decoder.current.code);
  local_16c = 1;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::token::code::value,trial::protocol::json::token::code::value>
            ("reader.code()","token::code::uninitialized",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/chunk_reader_suite.cpp"
             ,0x4d,"void number_suite::outer_real()",&local_168,&local_16c);
  local_168._M_len = 3;
  local_168._M_str = "0.0";
  bVar1 = trial::protocol::json::basic_chunk_reader<char>::next(&reader,&local_168);
  boost::detail::test_impl
            ("!reader.next(\"0.0\")",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/chunk_reader_suite.cpp"
             ,0x4e,"void number_suite::outer_real()",!bVar1);
  local_168._M_len =
       CONCAT44(local_168._M_len._4_4_,reader.super_basic_reader<char>.decoder.current.code);
  local_16c = 1;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::token::code::value,trial::protocol::json::token::code::value>
            ("reader.code()","token::code::uninitialized",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/chunk_reader_suite.cpp"
             ,0x4f,"void number_suite::outer_real()",&local_168,&local_16c);
  local_168._M_len = 3;
  local_168._M_str = "0.0";
  bVar1 = trial::protocol::json::basic_chunk_reader<char>::finish(&reader,&local_168);
  boost::detail::test_impl
            ("reader.finish(\"0.0\")",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/chunk_reader_suite.cpp"
             ,0x50,"void number_suite::outer_real()",bVar1);
  local_168._M_len =
       CONCAT44(local_168._M_len._4_4_,reader.super_basic_reader<char>.decoder.current.code);
  local_16c = 9;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::token::code::value,trial::protocol::json::token::code::value>
            ("reader.code()","token::code::real",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/chunk_reader_suite.cpp"
             ,0x51,"void number_suite::outer_real()",&local_168,&local_16c);
  std::
  _Vector_base<trial::protocol::json::basic_reader<char>::frame,_std::allocator<trial::protocol::json::basic_reader<char>::frame>_>
  ::~_Vector_base((_Vector_base<trial::protocol::json::basic_reader<char>::frame,_std::allocator<trial::protocol::json::basic_reader<char>::frame>_>
                   *)&reader.super_basic_reader<char>.stack);
  return;
}

Assistant:

void outer_real()
{
    // "0.0" is legal
    json::chunk_reader reader;
    TRIAL_PROTOCOL_TEST(!reader.next("0"));
    TRIAL_PROTOCOL_TEST_EQUAL(reader.code(), token::code::uninitialized); // Retains old state
    TRIAL_PROTOCOL_TEST(!reader.next("0."));
    TRIAL_PROTOCOL_TEST_EQUAL(reader.code(), token::code::uninitialized); // Retains old state
    TRIAL_PROTOCOL_TEST(!reader.next("0.0"));
    TRIAL_PROTOCOL_TEST_EQUAL(reader.code(), token::code::uninitialized); // Retains old state
    TRIAL_PROTOCOL_TEST(reader.finish("0.0"));
    TRIAL_PROTOCOL_TEST_EQUAL(reader.code(), token::code::real);
}